

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall despot::Logger::PrintStatistics(Logger *this,int num_runs)

{
  ostream *poVar1;
  double dVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nCompleted ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,num_runs);
  poVar1 = std::operator<<(poVar1," run(s).");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Average total discounted reward (stderr) = ");
  dVar2 = AverageDiscountedRoundReward(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," (");
  dVar2 = StderrDiscountedRoundReward(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Average total undiscounted reward (stderr) = ");
  dVar2 = AverageUndiscountedRoundReward(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," (");
  dVar2 = StderrUndiscountedRoundReward(this);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Logger::PrintStatistics(int num_runs) {
	cout << "\nCompleted " << num_runs << " run(s)." << endl;
	cout << "Average total discounted reward (stderr) = "
			<< AverageDiscountedRoundReward() << " ("
			<< StderrDiscountedRoundReward() << ")" << endl;
	cout << "Average total undiscounted reward (stderr) = "
			<< AverageUndiscountedRoundReward() << " ("
			<< StderrUndiscountedRoundReward() << ")" << endl;
}